

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Sub::Sub<int_const&>(Sub *this,string *key,int *value)

{
  int *value_local;
  string *key_local;
  Sub *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  ValueImpl<true>::ValueImpl<int_const&,void>(&this->value_,value);
  std::optional<google::protobuf::io::Printer::AnnotationRecord>::optional(&this->annotation_);
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}